

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O2

void __thiscall Downloader::Find(Downloader *this,string *package,bool downloadonly)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer pbVar4;
  vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_> pkglist
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  pair<int,_DownloadPackage> local_468;
  string compiler_original;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> e;
  string compiler;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string cpackage;
  DownloadPackage outpack;
  string local_220;
  string local_200;
  DownloadPackage inpack;
  DownloadPackage local_150;
  DownloadPackage local_c0;
  
  getUrl_abi_cxx11_(&local_2f0,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"tir",(allocator<char> *)&local_468);
  GetPackageList(&list,this,&local_2f0,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::__cxx11::string>>>
            (list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string((string *)&local_330,(string *)package);
  LibParse(&inpack,this,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"win64",(allocator<char> *)&outpack);
  this_00 = &inpack.options;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this_00->_M_t,(key_type *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"linux",(allocator<char> *)&outpack);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this_00->_M_t,(key_type *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"msvc",(allocator<char> *)&outpack);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this_00->_M_t,(key_type *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"gnuc",(allocator<char> *)&outpack);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this_00->_M_t,(key_type *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"cling",(allocator<char> *)&outpack);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this_00->_M_t,(key_type *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  get_compiler_abi_cxx11_(&compiler_original,this,true);
  std::__cxx11::string::string((string *)&local_350,(string *)&compiler_original);
  get_compiler_for_download(&compiler,this,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  bVar1 = std::operator==(&compiler,"");
  if (bVar1) {
    poVar3 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._52_4_);
    poVar3 = std::operator<<(poVar3,"The specified compiler is not supported.");
    poVar3 = operator<<(poVar3,(_xout_color)SUB41(ispring::xout._52_4_,3));
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,&compiler);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"linux",(allocator<char> *)&outpack);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  pkglist.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pkglist.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pkglist.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = false;
  pbVar4 = list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar4 == list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
    std::__cxx11::string::string((string *)&e,(string *)pbVar4);
    std::__cxx11::string::find_last_of((char *)&e,0x1301eb);
    std::__cxx11::string::substr((ulong)&cpackage,(ulong)&e);
    std::__cxx11::string::rfind((char)&cpackage,0x2e);
    std::__cxx11::string::substr((ulong)&local_200,(ulong)&cpackage);
    CLibParse(&outpack,this,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::_M_assign((string *)&outpack.url);
    iVar2 = DownloadPackage::match(&inpack,&outpack);
    if (iVar2 == -1) {
      DownloadPackage::DownloadPackage(&local_c0,&outpack);
      std::__cxx11::string::string((string *)&local_220,(string *)&compiler_original);
      Download(this,&local_c0,&local_220,downloadonly);
      std::__cxx11::string::~string((string *)&local_220);
      DownloadPackage::~DownloadPackage(&local_c0);
      bVar1 = true;
    }
    else if (iVar2 != 0x7fffffff) {
      local_468.first = iVar2;
      DownloadPackage::DownloadPackage(&local_468.second,&outpack);
      std::vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>::
      emplace_back<std::pair<int,DownloadPackage>>
                ((vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>
                  *)&pkglist,&local_468);
      DownloadPackage::~DownloadPackage(&local_468.second);
    }
    DownloadPackage::~DownloadPackage(&outpack);
    std::__cxx11::string::~string((string *)&cpackage);
    std::__cxx11::string::~string((string *)&e);
    pbVar4 = pbVar4 + 1;
  } while (iVar2 != -1);
  if (!bVar1) {
    if (pkglist.
        super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pkglist.
        super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar3 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._52_4_);
      poVar3 = std::operator<<(poVar3,
                               "ERROR: Could not find a version that satisfies the requirement ");
      poVar3 = std::operator<<(poVar3,(string *)&inpack);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"ERROR: No matching distribution found for ");
      std::operator<<(poVar3,(string *)&inpack);
      bVar1 = std::operator!=(&inpack.version,"");
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"==");
        std::operator<<(poVar3,(string *)&inpack.version);
      }
      poVar3 = operator<<((ostream *)&std::cout,(_xout_color)SUB41(ispring::xout._52_4_,3));
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::
      __stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,DownloadPackage>*,std::vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Downloader::Find(std::__cxx11::string,bool)::_lambda(std::pair<int,DownloadPackage>const&,std::pair<int,DownloadPackage>const&)_1_>>
                ();
      DownloadPackage::DownloadPackage
                (&local_150,
                 &(pkglist.
                   super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second);
      std::__cxx11::string::string((string *)&local_370,(string *)&compiler_original);
      Download(this,&local_150,&local_370,downloadonly);
      std::__cxx11::string::~string((string *)&local_370);
      DownloadPackage::~DownloadPackage(&local_150);
    }
  }
  std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>::
  ~vector(&pkglist);
  std::__cxx11::string::~string((string *)&compiler);
  std::__cxx11::string::~string((string *)&compiler_original);
  DownloadPackage::~DownloadPackage(&inpack);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return;
}

Assistant:

void Find(std::string package,bool downloadonly=false){
        auto list=GetPackageList(getUrl(), "tir");
        std::sort(list.begin(), list.end(), std::greater<std::string>());
        //1. 버전 없음   opencv
        //2. 버전 있음   opencv==3.4
        //3. 옵션 있음   opencv==3.4+cu100
        DownloadPackage inpack=LibParse(package);
        inpack.options.erase("win64");
        inpack.options.erase("linux");
        inpack.options.erase("msvc");
        inpack.options.erase("gnuc");
        inpack.options.erase("cling");
        std::string compiler_original=get_compiler();
        std::string compiler = get_compiler_for_download(compiler_original);
        if(compiler==""){
            std::cout << ispring::xout.red << "The specified compiler is not supported." << ispring::xout.white << std::endl;
            exit(1);
        }
        inpack.options.insert(compiler);
#if defined(_WIN32) || defined(_WIN64)
        inpack.options.insert("win64");
#elif defined(__linux__)
        inpack.options.insert("linux");
#endif
        bool match=false;
        std::vector<std::pair<int,DownloadPackage>> pkglist;
        for(auto e:list){
            int slash=e.find_last_of("/");
            std::string cpackage=e.substr(slash+1,e.length()-slash);
            DownloadPackage outpack=CLibParse(cpackage.substr(0,cpackage.find_last_of('.')));
            outpack.url=e;
            int diff=inpack.match(outpack);
            if(diff==-1) {
                match=true;
                Download(outpack,compiler_original,downloadonly);
                break;
            }else if(diff!=INT_MAX){
                pkglist.push_back(std::make_pair(diff,outpack));
            }
        }
        if(match==false && pkglist.empty()==false) {
            std::stable_sort(pkglist.begin(),pkglist.end(),[](const std::pair<int,DownloadPackage>& a,const std::pair<int,DownloadPackage>& b)->bool{
                return a.first < b.first;
            });
            match=true;
            Download(pkglist.front().second,compiler_original,downloadonly);
        }
        if(match==false){
            std::cout << ispring::xout.red << "ERROR: Could not find a version that satisfies the requirement " << inpack.libname << std::endl;
            std::cout << "ERROR: No matching distribution found for " << inpack.libname;
            if(inpack.version!="")
                std::cout << "==" << inpack.version ;
            std::cout << ispring::xout.white << std::endl;
        }
    }